

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O0

string * anon_unknown.dwarf_9b13b9::IndentText
                   (string *__return_storage_ptr__,string *text,cmMakefile *mf)

{
  undefined8 uVar1;
  bool bVar2;
  string *psVar3;
  cmake *this;
  ulong uVar4;
  bool local_2ba;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  allocator<char> local_259;
  string local_258;
  string_view local_238;
  cmAlphaNum local_228;
  string_view local_1f8;
  string_view local_1e8;
  cmAlphaNum local_1d0;
  string local_1a0;
  string_view local_180;
  string_view local_170;
  allocator<char> local_159;
  string local_158;
  string_view local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  undefined1 local_110 [8];
  string context;
  string local_e8;
  undefined1 local_c1;
  undefined1 auStack_c0 [7];
  bool showContext;
  string_view local_b0 [2];
  allocator<char> local_89;
  string local_88;
  string_view local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  undefined1 local_40 [8];
  string indent;
  cmMakefile *mf_local;
  string *text_local;
  
  indent.field_2._8_8_ = mf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"CMAKE_MESSAGE_INDENT",&local_89);
  psVar3 = cmMakefile::GetSafeDefinition(mf,&local_88);
  local_68 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3)
  ;
  cmExpandedList_abi_cxx11_(&local_58,local_68,false);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_b0,"");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_c0);
  cmJoin((string *)local_40,&local_58,local_b0[0],_auStack_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  context.field_2._M_local_buf[0xe] = '\0';
  context.field_2._M_local_buf[0xd] = '\0';
  this = cmMakefile::GetCMakeInstance((cmMakefile *)indent.field_2._8_8_);
  bVar2 = cmake::GetShowLogContext(this);
  uVar1 = indent.field_2._8_8_;
  local_2ba = true;
  if (!bVar2) {
    std::allocator<char>::allocator();
    context.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"CMAKE_MESSAGE_CONTEXT_SHOW",
               (allocator<char> *)(context.field_2._M_local_buf + 0xf));
    context.field_2._M_local_buf[0xd] = '\x01';
    local_2ba = cmMakefile::IsOn((cmMakefile *)uVar1,&local_e8);
  }
  if ((context.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_e8);
  }
  if ((context.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(context.field_2._M_local_buf + 0xf));
  }
  uVar1 = indent.field_2._8_8_;
  local_c1 = local_2ba;
  if (local_2ba != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"CMAKE_MESSAGE_CONTEXT",&local_159);
    psVar3 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_158);
    local_138 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
    cmExpandedList_abi_cxx11_(&local_128,local_138,false);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_170,".");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_180);
    cmJoin((string *)local_110,&local_128,local_170,local_180);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_128);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      local_1f8 = (string_view)::cm::operator____s("[",1);
      local_1e8 = local_1f8;
      cmAlphaNum::cmAlphaNum(&local_1d0,local_1f8);
      cmAlphaNum::cmAlphaNum(&local_228,(string *)local_110);
      local_238 = (string_view)::cm::operator____s("] ",2);
      cmStrCat<cm::static_string_view>
                (&local_1a0,&local_1d0,&local_228,(static_string_view *)&local_238);
      std::__cxx11::string::insert((ulong)local_40,(string *)0x0);
      std::__cxx11::string::~string((string *)&local_1a0);
    }
    std::__cxx11::string::~string((string *)local_110);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"\n",&local_259);
    std::operator+(&local_280,"\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    cmsys::SystemTools::ReplaceString(text,&local_258,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator(&local_259);
    std::__cxx11::string::insert((ulong)text,(string *)0x0);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)text);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string IndentText(std::string text, cmMakefile& mf)
{
  auto indent =
    cmJoin(cmExpandedList(mf.GetSafeDefinition("CMAKE_MESSAGE_INDENT")), "");

  const auto showContext = mf.GetCMakeInstance()->GetShowLogContext() ||
    mf.IsOn("CMAKE_MESSAGE_CONTEXT_SHOW");
  if (showContext) {
    auto context = cmJoin(
      cmExpandedList(mf.GetSafeDefinition("CMAKE_MESSAGE_CONTEXT")), ".");
    if (!context.empty()) {
      indent.insert(0u, cmStrCat("["_s, context, "] "_s));
    }
  }

  if (!indent.empty()) {
    cmSystemTools::ReplaceString(text, "\n", "\n" + indent);
    text.insert(0u, indent);
  }
  return text;
}